

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::PointwiseMatcher<iutest::detail::TwofoldEqMatcher,int[10]>::operator()
          (AssertionResult *__return_storage_ptr__,
          PointwiseMatcher<iutest::detail::TwofoldEqMatcher,int[10]> *this,int (*actual) [3])

{
  bool bVar1;
  int *b1;
  int *e1;
  int *b2;
  int *e2;
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  int (*local_20) [3];
  int (*actual_local) [3];
  PointwiseMatcher<iutest::detail::TwofoldEqMatcher,_int[10]> *this_local;
  
  local_20 = actual;
  actual_local = (int (*) [3])this;
  this_local = (PointwiseMatcher<iutest::detail::TwofoldEqMatcher,_int[10]> *)__return_storage_ptr__
  ;
  b1 = std::begin<int_const,10ul>(*(int (**) [10])(this + 0x10));
  e1 = std::end<int_const,10ul>(*(int (**) [10])(this + 0x10));
  b2 = std::begin<int_const,3ul>(local_20);
  e2 = std::end<int_const,3ul>(local_20);
  bVar1 = Check<int_const*,int_const*>(this,b1,e1,b2,e2);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Check(begin(m_expected), end(m_expected)
            , begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }